

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkcs7.c
# Opt level: O3

int pkcs7_verify_unwrap(scep *s,char *cachainfile)

{
  ulong uVar1;
  uint uVar2;
  int iVar3;
  uint len;
  BIO_METHOD *pBVar4;
  BIO *pBVar5;
  PKCS7 *pPVar6;
  char **b;
  stack_st_PKCS7_SIGNER_INFO *psVar7;
  FILE *pFVar8;
  FILE *pFVar9;
  X509_STORE *ctx;
  X509_STORE_CTX *ctx_00;
  FILE *pFVar10;
  PKCS7 *pPVar11;
  FILE *b_00;
  size_t __n;
  X509 **ppXVar12;
  ulong uVar13;
  void *__src;
  char *pcVar14;
  ASN1_OBJECT *a;
  ASN1_TYPE *pAVar15;
  X509_CRL *x;
  X509 *pXVar16;
  X509_NAME *pXVar17;
  X509_NAME *b_01;
  FILE *pFVar18;
  ASN1_INTEGER *x_00;
  X509_EXTENSION *pXVar19;
  ulong uVar20;
  int *piVar21;
  EVP_PKEY **buffer_00;
  ulong uVar22;
  uint extraout_EDX;
  FILE *extraout_RDX;
  undefined8 uVar23;
  FILE *pFVar24;
  char *pcVar25;
  char *pcVar26;
  int *piVar27;
  long lVar28;
  X509 *pXVar29;
  char **__size;
  uchar buffer [1024];
  uint uStack_25fc;
  PKCS7 *pPStack_25f8;
  BIO *pBStack_25f0;
  long lStack_25e8;
  byte abStack_25e0 [64];
  char acStack_25a0 [1024];
  char acStack_21a0 [1032];
  FILE *pFStack_1d98;
  int *piStack_1d90;
  X509 *pXStack_1d88;
  FILE *pFStack_1d80;
  char **ppcStack_1d78;
  FILE *pFStack_1d70;
  int aiStack_1d68 [258];
  FILE *pFStack_1960;
  int *piStack_1958;
  X509 *pXStack_1950;
  X509_CRL *pXStack_1948;
  FILE *pFStack_1940;
  FILE *pFStack_1938;
  FILE aFStack_1930 [4];
  FILE aFStack_1530 [4];
  char acStack_1130 [2056];
  FILE *pFStack_928;
  FILE *pFStack_920;
  FILE *pFStack_918;
  X509_CRL *pXStack_910;
  FILE *pFStack_908;
  FILE *pFStack_900;
  X509_CRL *pXStack_8f0;
  FILE *pFStack_8e8;
  FILE *pFStack_8e0;
  FILE *pFStack_8d8;
  X509_CRL *pXStack_8d0;
  FILE *pFStack_8c8;
  code *pcStack_8c0;
  X509_CRL *pXStack_8b0;
  FILE *pFStack_8a8;
  FILE *pFStack_8a0;
  FILE *pFStack_898;
  FILE *pFStack_890;
  FILE *pFStack_888;
  undefined1 auStack_878 [1040];
  scep *psStack_468;
  FILE *pFStack_460;
  X509_STORE *pXStack_458;
  X509_STORE_CTX *pXStack_450;
  FILE *pFStack_448;
  FILE *pFStack_440;
  undefined1 auStack_438 [1032];
  
  pFStack_440 = (FILE *)0x10cb97;
  pBVar4 = BIO_s_mem();
  pFStack_440 = (FILE *)0x10cb9f;
  pBVar5 = BIO_new(pBVar4);
  if (v_flag != 0) {
    pFStack_440 = (FILE *)0x10cbc6;
    printf("%s: reading outer PKCS#7\n",pname);
  }
  pFStack_440 = (FILE *)0x10cbdb;
  uVar2 = BIO_write(pBVar5,s->reply_payload,s->reply_len);
  if ((int)uVar2 < 1) {
    pFStack_440 = (FILE *)0x10cf65;
    pkcs7_verify_unwrap_cold_12();
LAB_0010cf65:
    pFStack_440 = (FILE *)0x10cf6a;
    pkcs7_verify_unwrap_cold_11();
LAB_0010cf6a:
    pFStack_440 = (FILE *)0x10cf6f;
    pkcs7_verify_unwrap_cold_1();
LAB_0010cf6f:
    pFStack_440 = (FILE *)0x10cf74;
    pkcs7_verify_unwrap_cold_10();
  }
  else {
    if (v_flag != 0) {
      pFStack_440 = (FILE *)0x10cc09;
      printf("%s: PKCS#7 payload size: %d bytes\n",pname,(ulong)uVar2);
    }
    pFStack_440 = (FILE *)0x10cc16;
    BIO_set_flags(pBVar5,0x200);
    pFStack_440 = (FILE *)0x10cc20;
    pPVar6 = (PKCS7 *)d2i_PKCS7_bio(pBVar5,(PKCS7 **)0x0);
    s->reply_p7 = pPVar6;
    if (pPVar6 == (PKCS7 *)0x0) goto LAB_0010cf65;
    if (d_flag != 0) {
      pFStack_440 = (FILE *)0x10cc54;
      printf("%s: printing PEM fomatted PKCS#7\n",pname);
      pFStack_440 = (FILE *)0x10cc6a;
      PEM_write_PKCS7(_stdout,(PKCS7 *)s->reply_p7);
      pPVar6 = s->reply_p7;
    }
    pFStack_440 = (FILE *)0x10cc7a;
    iVar3 = OBJ_obj2nid((ASN1_OBJECT *)pPVar6->type);
    if (iVar3 != 0x16) goto LAB_0010cf6a;
    pFStack_440 = (FILE *)0x10cc91;
    pBVar5 = PKCS7_dataInit((PKCS7 *)s->reply_p7,(BIO *)0x0);
    if (pBVar5 == (BIO *)0x0) goto LAB_0010cf6f;
    pFStack_440 = (FILE *)0x10cca2;
    pBVar4 = BIO_s_mem();
    pFStack_440 = (FILE *)0x10ccaa;
    b = (char **)BIO_new(pBVar4);
    pFStack_440 = (FILE *)0x10ccbd;
    uVar2 = BIO_read(pBVar5,auStack_438,0x400);
    len = uVar2;
    while (0 < (int)len) {
      pFStack_440 = (FILE *)0x10ccd5;
      BIO_write((BIO *)b,auStack_438,len);
      pFStack_440 = (FILE *)0x10cce5;
      len = BIO_read(pBVar5,auStack_438,0x400);
      uVar2 = uVar2 + len;
    }
    pFStack_440 = (FILE *)0x10ccfc;
    BIO_ctrl((BIO *)b,0xb,0,(void *)0x0);
    if (v_flag != 0) {
      pFStack_440 = (FILE *)0x10cd22;
      printf("%s: PKCS#7 contains %d bytes of signed data\n",pname,(ulong)uVar2);
    }
    pFStack_440 = (FILE *)0x10cd2e;
    psVar7 = PKCS7_get_signer_info((PKCS7 *)s->reply_p7);
    if (psVar7 != (stack_st_PKCS7_SIGNER_INFO *)0x0) {
      if (v_flag != 0) {
        pFStack_440 = (FILE *)0x10cd5e;
        printf("%s: verifying signature\n",pname);
      }
      pFStack_440 = (FILE *)0x10cd68;
      pFVar8 = (FILE *)OPENSSL_sk_value(psVar7,0);
      pFStack_440 = (FILE *)0x10cd7a;
      pFVar9 = (FILE *)PKCS7_cert_from_signer_info((PKCS7 *)s->reply_p7,(PKCS7_SIGNER_INFO *)pFVar8)
      ;
      if (pFVar9 == (FILE *)0x0) {
        pFStack_440 = (FILE *)0x10cd9a;
        printf("%s: Can\'t read signer cert from pkcs7\n",pname);
      }
      pFStack_440 = (FILE *)0x10cdaf;
      iVar3 = PKCS7_signatureVerify
                        (pBVar5,(PKCS7 *)s->reply_p7,(PKCS7_SIGNER_INFO *)pFVar8,(X509 *)pFVar9);
      if (iVar3 < 1) goto LAB_0010cf79;
      if (v_flag != 0) {
        pFStack_440 = (FILE *)0x10cddb;
        printf("%s: signature ok\n");
      }
      pFStack_440 = (FILE *)0x10cde0;
      ctx = X509_STORE_new();
      if (ctx == (X509_STORE *)0x0) {
        pFStack_440 = (FILE *)0x10cf3d;
        pkcs7_verify_unwrap_cold_2();
      }
      pFStack_440 = (FILE *)0x10cdf6;
      X509_STORE_set_flags(ctx,0);
      pFStack_440 = (FILE *)0x10ce03;
      X509_STORE_load_locations(ctx,cachainfile,(char *)0x0);
      pFStack_440 = (FILE *)0x10ce08;
      ctx_00 = X509_STORE_CTX_new();
      if (ctx_00 == (X509_STORE_CTX *)0x0) {
        pFStack_440 = (FILE *)0x10cf47;
        pkcs7_verify_unwrap_cold_3();
      }
      buffer_00 = (EVP_PKEY **)0x0;
      pFStack_440 = (FILE *)0x10ce24;
      iVar3 = X509_STORE_CTX_init(ctx_00,ctx,(X509 *)pFVar9,(stack_st_X509 *)0x0);
      if (iVar3 == 0) {
        pFStack_440 = (FILE *)0x10cf51;
        pkcs7_verify_unwrap_cold_4();
      }
      pFStack_440 = (FILE *)0x10ce34;
      iVar3 = X509_verify_cert(ctx_00);
      if (iVar3 == 0) {
        pFStack_440 = (FILE *)0x10cf5b;
        pkcs7_verify_unwrap_cold_5();
      }
      pFVar10 = pFVar8;
      if (w_flag == 0) {
LAB_0010cefa:
        pFStack_440 = (FILE *)0x10cf04;
        pFVar18 = (FILE *)b;
        pPVar6 = (PKCS7 *)d2i_PKCS7_bio((BIO *)b,(PKCS7 **)0x0);
        s->reply_p7 = pPVar6;
        if (pPVar6 != (PKCS7 *)0x0) {
          pFStack_440 = (FILE *)0x10cf1c;
          X509_STORE_free(ctx);
          pFStack_440 = (FILE *)0x10cf24;
          X509_STORE_CTX_cleanup(ctx_00);
          return 0;
        }
        pFStack_440 = (FILE *)0x10cfaf;
        pkcs7_verify_unwrap_cold_8();
        pFVar8 = pFVar10;
LAB_0010cfaf:
        pFVar10 = pFVar8;
        pFStack_440 = (FILE *)0x10cfb4;
        pkcs7_verify_unwrap_cold_7();
      }
      else {
        pFStack_440 = (FILE *)0x10ce62;
        pFVar18 = (FILE *)w_char;
        pFVar10 = fopen(w_char,"w");
        if (pFVar10 == (FILE *)0x0) goto LAB_0010cfaf;
        if (v_flag != 0) {
          pFStack_440 = (FILE *)0x10ce92;
          printf("%s: writing cert\n",w_char);
        }
        if (d_flag != 0) {
          pFStack_440 = (FILE *)0x10ceb0;
          PEM_write_X509(_stdout,(X509 *)pFVar9);
        }
        pFStack_440 = (FILE *)0x10cebb;
        pFVar18 = pFVar10;
        iVar3 = PEM_write_X509(pFVar10,(X509 *)pFVar9);
        if (iVar3 == 1) {
          if (v_flag != 0) {
            pFStack_440 = (FILE *)0x10cef2;
            printf("%s: certificate written as %s\n",pname,w_char);
          }
          pFStack_440 = (FILE *)0x10cefa;
          fclose(pFVar10);
          goto LAB_0010cefa;
        }
      }
      pFStack_440 = (FILE *)pkcs7_unwrap;
      pkcs7_verify_unwrap_cold_6();
      pFStack_888 = (FILE *)0x10cfd2;
      psStack_468 = s;
      pFStack_460 = pFVar9;
      pXStack_458 = ctx;
      pXStack_450 = ctx_00;
      pFStack_448 = (FILE *)b;
      pFStack_440 = pFVar10;
      pBVar4 = BIO_s_mem();
      pFStack_888 = (FILE *)0x10cfda;
      pFVar8 = (FILE *)BIO_new(pBVar4);
      piVar27 = &v_flag;
      if (v_flag != 0) {
        pFStack_888 = (FILE *)0x10d003;
        printf("%s: reading outer PKCS#7\n",pname);
      }
      pFVar24 = *(FILE **)&pFVar18->_mode;
      pFStack_888 = (FILE *)0x10d018;
      pcVar25 = (char *)pFVar8;
      uVar2 = BIO_write((BIO *)pFVar8,pFVar24,*(int *)(pFVar18->_unused2 + 4));
      if ((int)uVar2 < 1) {
        pFStack_888 = (FILE *)0x10d6bd;
        pkcs7_unwrap_cold_20();
LAB_0010d6bd:
        pFStack_888 = (FILE *)0x10d6c2;
        pkcs7_unwrap_cold_1();
LAB_0010d6c2:
        pFStack_888 = (FILE *)0x10d6c7;
        pkcs7_unwrap_cold_19();
LAB_0010d6c7:
        pFStack_888 = (FILE *)0x10d6cc;
        pkcs7_unwrap_cold_18();
LAB_0010d6cc:
        pFStack_888 = (FILE *)0x10d6d1;
        pkcs7_unwrap_cold_17();
LAB_0010d6d1:
        pFStack_888 = (FILE *)0x10d6d6;
        pkcs7_unwrap_cold_16();
LAB_0010d6d6:
        pcVar26 = (char *)pFVar9;
        pFStack_888 = (FILE *)0x10d6db;
        pkcs7_unwrap_cold_2();
LAB_0010d6db:
        pFStack_888 = (FILE *)0x10d6e0;
        pkcs7_unwrap_cold_3();
LAB_0010d6e0:
        pFStack_888 = (FILE *)0x10d6e5;
        pkcs7_unwrap_cold_4();
LAB_0010d6e5:
        pFStack_888 = (FILE *)0x10d6ea;
        pkcs7_unwrap_cold_5();
LAB_0010d6ea:
        pFStack_888 = (FILE *)0x10d6ef;
        pkcs7_unwrap_cold_6();
LAB_0010d6ef:
        pFStack_888 = (FILE *)0x10d6f4;
        pkcs7_unwrap_cold_8();
LAB_0010d6f4:
        pFStack_888 = (FILE *)0x10d6f9;
        pkcs7_unwrap_cold_14();
LAB_0010d6f9:
        pFVar9 = pFVar10;
        pFStack_888 = (FILE *)0x10d6fe;
        pkcs7_unwrap_cold_13();
LAB_0010d6fe:
        pFStack_888 = (FILE *)0x10d703;
        pkcs7_unwrap_cold_12();
LAB_0010d703:
        pFStack_888 = (FILE *)0x10d708;
        pkcs7_unwrap_cold_15();
        pFVar10 = pFVar9;
LAB_0010d708:
        pFStack_888 = (FILE *)0x10d70d;
        pkcs7_unwrap_cold_9();
        auStack_878._0_8_ = pcVar25;
      }
      else {
        if (v_flag != 0) {
          pFStack_888 = (FILE *)0x10d041;
          printf("%s: PKCS#7 payload size: %d bytes\n",pname,(ulong)uVar2);
        }
        pFStack_888 = (FILE *)0x10d04e;
        BIO_set_flags((BIO *)pFVar8,0x200);
        pFVar24 = (FILE *)0x0;
        pFStack_888 = (FILE *)0x10d058;
        pPVar11 = d2i_PKCS7_bio((BIO *)pFVar8,(PKCS7 **)0x0);
        pFVar18->__pad5 = (size_t)pPVar11;
        piVar21 = &d_flag;
        buffer_00 = (EVP_PKEY **)piVar21;
        if (d_flag != 0) {
          pFStack_888 = (FILE *)0x10d083;
          printf("%s: printing PEM fomatted PKCS#7\n",pname);
          pFVar24 = (FILE *)pFVar18->__pad5;
          pFStack_888 = (FILE *)0x10d099;
          PEM_write_PKCS7(_stdout,(PKCS7 *)pFVar24);
          pPVar11 = (PKCS7 *)pFVar18->__pad5;
          buffer_00 = (EVP_PKEY **)piVar21;
        }
        pcVar25 = (char *)pPVar11->type;
        pFStack_888 = (FILE *)0x10d0a9;
        iVar3 = OBJ_obj2nid((ASN1_OBJECT *)pcVar25);
        if (iVar3 != 0x16) goto LAB_0010d6bd;
        pcVar25 = (char *)pFVar18->__pad5;
        pFVar24 = (FILE *)0x0;
        pFStack_888 = (FILE *)0x10d0c0;
        b_00 = (FILE *)PKCS7_dataInit((PKCS7 *)pcVar25,(BIO *)0x0);
        if (b_00 == (FILE *)0x0) goto LAB_0010d6c2;
        pFStack_888 = (FILE *)0x10d0d1;
        pBVar4 = BIO_s_mem();
        pFStack_888 = (FILE *)0x10d0d9;
        pFVar8 = (FILE *)BIO_new(pBVar4);
        pFStack_888 = (FILE *)0x10d0ee;
        uVar2 = BIO_read((BIO *)b_00,auStack_878 + 8,0x400);
        pFVar24 = (FILE *)(ulong)uVar2;
        pFVar10 = pFVar24;
        if (0 < (int)uVar2) {
          pFVar9 = (FILE *)(auStack_878 + 8);
          do {
            pFStack_888 = (FILE *)0x10d108;
            BIO_write((BIO *)pFVar8,pFVar9,(int)pFVar24);
            pFStack_888 = (FILE *)0x10d118;
            uVar2 = BIO_read((BIO *)b_00,pFVar9,0x400);
            pFVar24 = (FILE *)(ulong)uVar2;
            pFVar10 = (FILE *)(ulong)((int)pFVar10 + uVar2);
          } while (0 < (int)uVar2);
        }
        pFVar24 = (FILE *)0xb;
        buffer_00 = (EVP_PKEY **)0x0;
        pFStack_888 = (FILE *)0x10d12f;
        BIO_ctrl((BIO *)pFVar8,0xb,0,(void *)0x0);
        if (v_flag != 0) {
          pFStack_888 = (FILE *)0x10d150;
          pFVar24 = (FILE *)pname;
          printf("%s: PKCS#7 contains %d bytes of enveloped data\n",pname,pFVar10);
        }
        pcVar25 = (char *)pFVar18->__pad5;
        pFStack_888 = (FILE *)0x10d15c;
        psVar7 = PKCS7_get_signer_info((PKCS7 *)pcVar25);
        b = (char **)b_00;
        if (psVar7 == (stack_st_PKCS7_SIGNER_INFO *)0x0) goto LAB_0010d6c7;
        if (v_flag != 0) {
          pFStack_888 = (FILE *)0x10d187;
          printf("%s: verifying signature\n",pname);
        }
        pFStack_888 = (FILE *)0x10d191;
        pFVar9 = (FILE *)OPENSSL_sk_value(psVar7,0);
        pFVar24 = (FILE *)pFVar18->__pad5;
        pFStack_888 = (FILE *)0x10d1b0;
        buffer_00 = (EVP_PKEY **)cacert;
        pcVar25 = (char *)b_00;
        iVar3 = PKCS7_signatureVerify
                          ((BIO *)b_00,(PKCS7 *)pFVar24,(PKCS7_SIGNER_INFO *)pFVar9,(X509 *)cacert);
        if (iVar3 < 1) goto LAB_0010d6cc;
        if (v_flag != 0) {
          pcVar25 = "%s: signature ok\n";
          pFStack_888 = (FILE *)0x10d1d7;
          pFVar24 = (FILE *)pname;
          printf("%s: signature ok\n");
        }
        if (d_flag != 0) {
          pcVar25 = "%s: finding signed attributes\n";
          pFStack_888 = (FILE *)0x10d1fb;
          pFVar24 = (FILE *)pname;
          printf("%s: finding signed attributes\n");
        }
        b = (char **)pFVar9->_IO_read_base;
        if ((FILE *)b == (FILE *)0x0) goto LAB_0010d6d1;
        pFVar24 = (FILE *)(ulong)(uint)nid_transId;
        buffer_00 = (EVP_PKEY **)auStack_878;
        pFStack_888 = (FILE *)0x10d224;
        pcVar25 = (char *)b;
        iVar3 = get_signed_attribute
                          ((stack_st_X509_ATTRIBUTE *)b,nid_transId,0x13,(char **)buffer_00);
        pcVar26 = (char *)auStack_878._0_8_;
        if (iVar3 != 0) goto LAB_0010d6d6;
        pFStack_888 = (FILE *)0x10d24c;
        printf("%s: reply transaction id: %s\n",pname,auStack_878._0_8_);
        piVar27 = (int *)pFVar18->_IO_buf_end;
        pFStack_888 = (FILE *)0x10d258;
        __n = strlen(pcVar26);
        pFStack_888 = (FILE *)0x10d266;
        pFVar24 = (FILE *)pcVar26;
        pcVar25 = (char *)piVar27;
        iVar3 = strncmp((char *)piVar27,pcVar26,__n);
        if (iVar3 != 0) goto LAB_0010d6db;
        pFVar24 = (FILE *)(ulong)(uint)nid_messageType;
        buffer_00 = (EVP_PKEY **)auStack_878;
        pFStack_888 = (FILE *)0x10d289;
        pcVar25 = (char *)b;
        iVar3 = get_signed_attribute
                          ((stack_st_X509_ATTRIBUTE *)b,nid_messageType,0x13,(char **)buffer_00);
        piVar27 = &v_flag;
        if (iVar3 != 0) goto LAB_0010d6e0;
        pFStack_888 = (FILE *)0x10d2a2;
        pcVar25 = (char *)auStack_878._0_8_;
        iVar3 = atoi((char *)auStack_878._0_8_);
        if (iVar3 != 3) goto LAB_0010d6e5;
        if (v_flag != 0) {
          pFStack_888 = (FILE *)0x10d2ca;
          printf("%s: reply message type is good\n",pname);
        }
        pFStack_888 = (FILE *)0x10d2e5;
        iVar3 = get_signed_attribute
                          ((stack_st_X509_ATTRIBUTE *)b,nid_senderNonce,4,(char **)auStack_878);
        if (v_flag != 0 && iVar3 != 0) {
          pFStack_888 = (FILE *)0x10d6a5;
          fprintf(_stderr,"%s: cannot find senderNonce\n",pname);
        }
        iVar3 = v_flag;
        pFVar18->_markers = (_IO_marker *)auStack_878._0_8_;
        if (iVar3 != 0) {
          pFStack_888 = (FILE *)0x10d323;
          printf("%s: senderNonce in reply: ",pname);
          pcVar26 = "%02X";
          lVar28 = 0;
          do {
            pFStack_888 = (FILE *)0x10d340;
            printf("%02X",(ulong)*(byte *)((long)&pFVar18->_markers->_next + lVar28));
            lVar28 = lVar28 + 1;
          } while (lVar28 != 0x10);
          pFStack_888 = (FILE *)0x10d353;
          putchar(10);
        }
        piVar27 = &v_flag;
        pFVar24 = (FILE *)(ulong)(uint)nid_recipientNonce;
        buffer_00 = (EVP_PKEY **)auStack_878;
        pFStack_888 = (FILE *)0x10d375;
        pcVar25 = (char *)b;
        iVar3 = get_signed_attribute
                          ((stack_st_X509_ATTRIBUTE *)b,nid_recipientNonce,4,(char **)buffer_00);
        if (iVar3 != 0) goto LAB_0010d6ea;
        pFVar18->_IO_save_end = (char *)auStack_878._0_8_;
        pFVar9 = (FILE *)auStack_878._0_8_;
        if (v_flag != 0) {
          pFStack_888 = (FILE *)0x10d3a5;
          printf("%s: recipientNonce in reply: ",pname);
          lVar28 = 0;
          do {
            pFStack_888 = (FILE *)0x10d3c2;
            printf("%02X",(ulong)(byte)pFVar18->_IO_save_end[lVar28]);
            lVar28 = lVar28 + 1;
          } while (lVar28 != 0x10);
          pFStack_888 = (FILE *)0x10d3d5;
          putchar(10);
          pFVar9 = (FILE *)pFVar18->_IO_save_end;
        }
        piVar27 = &v_flag;
        pcVar26 = (char *)&pFVar18->_mode;
        lVar28 = 0;
        do {
          if (pFVar18->_IO_save_base[lVar28] != *(char *)((long)&pFVar9->_flags + lVar28)) {
            if (v_flag != 0) {
              pFStack_888 = (FILE *)0x10d6b3;
              pkcs7_unwrap_cold_7();
            }
            break;
          }
          lVar28 = lVar28 + 1;
        } while (lVar28 != 0x10);
        pFVar24 = (FILE *)(ulong)(uint)nid_pkiStatus;
        buffer_00 = (EVP_PKEY **)auStack_878;
        pFStack_888 = (FILE *)0x10d428;
        pcVar25 = (char *)b;
        iVar3 = get_signed_attribute
                          ((stack_st_X509_ATTRIBUTE *)b,nid_pkiStatus,0x13,(char **)buffer_00);
        if (iVar3 != 0) goto LAB_0010d6ef;
        pFStack_888 = (FILE *)0x10d43a;
        pcVar25 = (char *)auStack_878._0_8_;
        iVar3 = atoi((char *)auStack_878._0_8_);
        if (iVar3 == 3) {
          pFStack_888 = (FILE *)0x10d534;
          printf("%s: pkistatus: PENDING\n",pname);
          *(undefined4 *)&pFVar18->_IO_write_base = 3;
LAB_0010d53b:
          if (v_flag == 0) {
            return 0;
          }
          if ((int)pFVar10 == 0) {
            return 0;
          }
          pFStack_888 = (FILE *)0x10d553;
          pkcs7_unwrap_cold_11();
          return 0;
        }
        if (iVar3 != 2) {
          pFVar9 = pFVar10;
          if (iVar3 == 0) {
            pcVar25 = "%s: pkistatus: SUCCESS\n";
            pFStack_888 = (FILE *)0x10d468;
            pFVar24 = (FILE *)pname;
            printf("%s: pkistatus: SUCCESS\n");
            *(undefined4 *)&pFVar18->_IO_write_base = 0;
LAB_0010d4fa:
            if ((int)pFVar10 == 0) goto LAB_0010d6f4;
            if (pFVar18->_flags - 0x13U < 2) {
              ppXVar12 = (X509 **)&pFVar18->_fileno;
              buffer_00 = (EVP_PKEY **)&pFVar18->_old_offset;
            }
            else {
              ppXVar12 = &localcert;
              buffer_00 = &rsa;
            }
            b = (char **)*buffer_00;
            piVar27 = (int *)*ppXVar12;
            pFVar24 = (FILE *)0x0;
            pFStack_888 = (FILE *)0x10d570;
            pcVar25 = (char *)pFVar8;
            pFVar9 = (FILE *)d2i_PKCS7_bio((BIO *)pFVar8,(PKCS7 **)0x0);
            if (pFVar9 == (FILE *)0x0) goto LAB_0010d6f9;
            if (d_flag != 0) {
              pFStack_888 = (FILE *)0x10d5a0;
              printf("%s: printing PEM fomatted PKCS#7\n",pname);
              pFStack_888 = (FILE *)0x10d5b2;
              PEM_write_PKCS7(_stdout,(PKCS7 *)pFVar9);
            }
            pFStack_888 = (FILE *)0x10d5b7;
            pBVar4 = BIO_s_mem();
            pFStack_888 = (FILE *)0x10d5bf;
            pFVar8 = (FILE *)BIO_new(pBVar4);
            if (d_flag != 0) {
              pFStack_888 = (FILE *)0x10d5e6;
              printf("%s: decrypting inner PKCS#7\n",pname);
            }
            pFStack_888 = (FILE *)0x10d5fa;
            buffer_00 = (EVP_PKEY **)pFVar8;
            pFVar24 = (FILE *)b;
            pcVar25 = (char *)pFVar9;
            iVar3 = PKCS7_decrypt((PKCS7 *)pFVar9,(EVP_PKEY *)b,(X509 *)piVar27,(BIO *)pFVar8,0);
            if (iVar3 != 0) {
              pFStack_888 = (FILE *)0x10d613;
              BIO_ctrl((BIO *)pFVar8,0xb,0,(void *)0x0);
              pFStack_888 = (FILE *)0x10d625;
              uVar13 = BIO_ctrl((BIO *)pFVar8,3,0,pcVar26);
              *(int *)(pFVar18->_unused2 + 4) = (int)uVar13;
              if (v_flag != 0) {
                pFStack_888 = (FILE *)0x10d651;
                printf("%s: PKCS#7 payload size: %d bytes\n",pname,uVar13 & 0xffffffff);
              }
              pFStack_888 = (FILE *)0x10d65e;
              BIO_set_flags((BIO *)pFVar8,0x200);
              pFStack_888 = (FILE *)0x10d668;
              pPVar11 = d2i_PKCS7_bio((BIO *)pFVar8,(PKCS7 **)0x0);
              pFVar18->__pad5 = (size_t)pPVar11;
              return 0;
            }
            goto LAB_0010d6fe;
          }
          goto LAB_0010d703;
        }
        pFStack_888 = (FILE *)0x10d48c;
        printf("%s: pkistatus: FAILURE\n",pname);
        *(undefined4 *)&pFVar18->_IO_write_base = 2;
        pFVar24 = (FILE *)(ulong)(uint)nid_failInfo;
        buffer_00 = (EVP_PKEY **)auStack_878;
        pFStack_888 = (FILE *)0x10d4ae;
        pcVar25 = (char *)b;
        iVar3 = get_signed_attribute
                          ((stack_st_X509_ATTRIBUTE *)b,nid_failInfo,0x13,(char **)buffer_00);
        if (iVar3 != 0) goto LAB_0010d708;
        pFStack_888 = (FILE *)0x10d4c0;
        uVar2 = atoi((char *)auStack_878._0_8_);
        if (uVar2 < 5) {
          buffer_00 = (EVP_PKEY **)(ulong)uVar2;
          iVar3 = *(int *)(&DAT_00111428 + (long)buffer_00 * 4);
          *(uint *)&pFVar18->_IO_write_end = uVar2;
          pcVar25 = "%s: reason: %s\n";
          pFStack_888 = (FILE *)0x10d4f4;
          pFVar24 = (FILE *)pname;
          printf("%s: reason: %s\n",pname,&DAT_00111428 + iVar3);
          if (*(int *)&pFVar18->_IO_write_base != 0) goto LAB_0010d53b;
          goto LAB_0010d4fa;
        }
      }
      pFStack_888 = (FILE *)get_signed_attribute;
      pkcs7_unwrap_cold_10();
      pcStack_8c0 = (code *)0x10d72d;
      pFStack_8a8 = pFVar18;
      pFStack_8a0 = (FILE *)pcVar26;
      pFStack_898 = pFVar8;
      pFStack_890 = (FILE *)b;
      pFStack_888 = pFVar10;
      iVar3 = get_attribute((stack_st_X509_ATTRIBUTE *)auStack_878._0_8_,(int)pFVar24,
                            (ASN1_TYPE **)&pXStack_8b0);
      if (iVar3 != 0) {
        if (v_flag == 0) {
          return 1;
        }
        pcStack_8c0 = (code *)0x10d802;
        get_signed_attribute_cold_1();
        return 1;
      }
      pcStack_8c0 = (code *)0x10d764;
      __size = (char **)pXStack_8b0;
      uVar2 = ASN1_TYPE_get((ASN1_TYPE *)pXStack_8b0);
      if (uVar2 == extraout_EDX) {
        pcStack_8c0 = (code *)0x10d775;
        uVar2 = ASN1_STRING_length((ASN1_STRING *)pXStack_8b0->sig_alg);
        if ((int)uVar2 < 1) {
          return 1;
        }
        b = (char **)(ulong)uVar2;
        if (d_flag != 0) {
          pcStack_8c0 = (code *)0x10d7a3;
          pFVar24 = (FILE *)pname;
          printf("%s: allocating %d bytes for attribute\n",pname,b);
        }
        __size = (char **)(ulong)((extraout_EDX == 0x13) + uVar2);
        pcStack_8c0 = (code *)0x10d7b4;
        pcVar25 = (char *)malloc((size_t)__size);
        *buffer_00 = (EVP_PKEY *)pcVar25;
        if (pcVar25 != (char *)0x0) {
          pcStack_8c0 = (code *)0x10d7c8;
          __src = (void *)ASN1_STRING_get0_data(pXStack_8b0->sig_alg);
          pcStack_8c0 = (code *)0x10d7d9;
          memcpy(pcVar25,__src,(size_t)b);
          if (extraout_EDX != 0x13) {
            return 0;
          }
          (*buffer_00)[(long)b] = (EVP_PKEY)0x0;
          return 0;
        }
      }
      else {
        pcStack_8c0 = (code *)0x10d80c;
        get_signed_attribute_cold_2();
      }
      pcStack_8c0 = get_attribute;
      get_signed_attribute_cold_3();
      pcVar25 = pname;
      pXStack_8d0 = pXStack_8b0;
      pFVar9 = (FILE *)((ulong)pFVar24 & 0xffffffff);
      pFStack_8e0 = (FILE *)buffer_00;
      pFStack_8d8 = (FILE *)pcVar26;
      pFStack_8c8 = (FILE *)b;
      pcStack_8c0 = (code *)(ulong)extraout_EDX;
      if (d_flag != 0) {
        pFStack_8e8 = (FILE *)0x10d83e;
        pcVar14 = OBJ_nid2sn((int)pFVar24);
        pFStack_8e8 = (FILE *)0x10d852;
        printf("%s: finding attribute %s\n",pcVar25,pcVar14);
        b = (char **)pcVar25;
      }
      *(long *)extraout_RDX = 0;
      pFStack_8e8 = (FILE *)0x10d860;
      pFVar8 = pFVar9;
      pFVar10 = (FILE *)OBJ_nid2obj((int)pFVar24);
      if (pFVar10 != (FILE *)0x0) {
        pFStack_8e8 = (FILE *)0x10d870;
        iVar3 = OPENSSL_sk_num(__size);
        if (0 < iVar3) {
          pFVar9 = (FILE *)0x0;
          do {
            pFStack_8e8 = (FILE *)0x10d880;
            pcVar26 = (char *)OPENSSL_sk_value(__size,pFVar9);
            pFStack_8e8 = (FILE *)0x10d88b;
            a = X509_ATTRIBUTE_get0_object((X509_ATTRIBUTE *)pcVar26);
            pFStack_8e8 = (FILE *)0x10d896;
            iVar3 = OBJ_cmp(a,(ASN1_OBJECT *)pFVar10);
            if (iVar3 == 0) {
              pFStack_8e8 = (FILE *)0x10d8a2;
              pFVar8 = (FILE *)pcVar26;
              iVar3 = X509_ATTRIBUTE_count((X509_ATTRIBUTE *)pcVar26);
              if (iVar3 != 0) {
                if (*(long *)extraout_RDX != 0) {
                  pFStack_8e8 = (FILE *)0x10d8de;
                  get_attribute_cold_1();
                  b = (char **)pFVar10;
                  goto LAB_0010d8de;
                }
                pFStack_8e8 = (FILE *)0x10d8b6;
                pAVar15 = X509_ATTRIBUTE_get0_type((X509_ATTRIBUTE *)pcVar26,0);
                *(ASN1_TYPE **)extraout_RDX = pAVar15;
              }
            }
            uVar2 = (int)pFVar9 + 1;
            pFVar9 = (FILE *)(ulong)uVar2;
            pFStack_8e8 = (FILE *)0x10d8c3;
            iVar3 = OPENSSL_sk_num(__size);
          } while ((int)uVar2 < iVar3);
        }
        return (int)(*(long *)extraout_RDX == 0);
      }
LAB_0010d8de:
      pFStack_8e8 = (FILE *)0x10d8e3;
      get_attribute_cold_2();
      pFVar8 = *(FILE **)(*(long *)(pFVar8->__pad5 + 0x20) + 0x18);
      pFStack_900 = (FILE *)0x10d8ff;
      pXStack_8f0 = (X509_CRL *)__size;
      pFStack_8e8 = (FILE *)b;
      x = (X509_CRL *)OPENSSL_sk_value(pFVar8,0);
      if (x == (X509_CRL *)0x0) {
        pFStack_900 = (FILE *)0x10d9ac;
        write_crl_cold_3();
LAB_0010d9ac:
        pFStack_900 = (FILE *)0x10d9b1;
        write_crl_cold_2();
        pFVar10 = extraout_RDX;
      }
      else {
        b = &w_char;
        pFStack_900 = (FILE *)0x10d921;
        pFVar8 = (FILE *)w_char;
        pFVar10 = fopen(w_char,"w");
        __size = (char **)x;
        if (pFVar10 == (FILE *)0x0) goto LAB_0010d9ac;
        if (v_flag != 0) {
          pFStack_900 = (FILE *)0x10d951;
          printf("%s: writing CRL\n",pname);
        }
        if (d_flag != 0) {
          pFStack_900 = (FILE *)0x10d96f;
          PEM_write_X509_CRL(_stdout,x);
        }
        pFStack_900 = (FILE *)0x10d97a;
        pFVar8 = pFVar10;
        iVar3 = PEM_write_X509_CRL(pFVar10,x);
        if (iVar3 == 1) {
          pFStack_900 = (FILE *)0x10d99a;
          printf("%s: CRL written as %s\n",pname,w_char);
          iVar3 = fclose(pFVar10);
          return iVar3;
        }
      }
      pFStack_900 = (FILE *)write_local_cert;
      write_crl_cold_1();
      localcert = (X509 *)0x0;
      pFVar8 = *(FILE **)(*(long *)(pFVar8->__pad5 + 0x20) + 0x10);
      pFStack_928 = pFVar10;
      pFStack_920 = (FILE *)pcVar26;
      pFStack_918 = (FILE *)piVar27;
      pXStack_910 = (X509_CRL *)__size;
      pFStack_908 = (FILE *)b;
      pFStack_900 = pFVar9;
      if (v_flag != 0) {
        pFStack_1938 = (FILE *)0x10d9f7;
        uVar2 = OPENSSL_sk_num(pFVar8);
        pFStack_1938 = (FILE *)0x10da07;
        printf("write_local_cert(): found %d cert(s)\n",(ulong)uVar2);
      }
      pFStack_1938 = (FILE *)0x10da0f;
      pFVar10 = pFVar8;
      iVar3 = OPENSSL_sk_num();
      pXVar16 = (X509 *)localcert;
      if (0 < iVar3) {
        __size = (char **)0x0;
        do {
          pFStack_1938 = (FILE *)0x10da25;
          pXVar16 = (X509 *)OPENSSL_sk_value(pFVar8,__size);
          pcVar25 = pname;
          if (v_flag != 0) {
            pFStack_1938 = (FILE *)0x10da45;
            pXVar17 = X509_get_subject_name(pXVar16);
            pFStack_1938 = (FILE *)0x10da58;
            pcVar26 = X509_NAME_oneline(pXVar17,(char *)aFStack_1930,0x400);
            pFStack_1938 = (FILE *)0x10da6c;
            printf("%s: found certificate with\n  subject: \'%s\'\n",pcVar25,pcVar26);
            pFStack_1938 = (FILE *)0x10da74;
            pXVar17 = X509_get_issuer_name(pXVar16);
            pFStack_1938 = (FILE *)0x10da84;
            pcVar25 = X509_NAME_oneline(pXVar17,(char *)aFStack_1930,0x400);
            pFStack_1938 = (FILE *)0x10da95;
            printf("  issuer: %s\n",pcVar25);
            pFStack_1938 = (FILE *)0x10daa1;
            pXVar17 = (X509_NAME *)X509_REQ_get_subject_name(request);
            pFStack_1938 = (FILE *)0x10dab1;
            pcVar25 = X509_NAME_oneline(pXVar17,(char *)aFStack_1930,0x400);
            pFStack_1938 = (FILE *)0x10dac2;
            printf("  request_subject: \'%s\'\n",pcVar25);
            pFVar9 = aFStack_1930;
          }
          pFStack_1938 = (FILE *)0x10daca;
          pXVar17 = X509_get_subject_name(pXVar16);
          pFStack_1938 = (FILE *)0x10dad9;
          b_01 = (X509_NAME *)X509_REQ_get_subject_name(request);
          pFStack_1938 = (FILE *)0x10dae4;
          iVar3 = X509_NAME_cmp(pXVar17,b_01);
          if (d_flag != 0) {
            pFStack_1938 = (FILE *)0x10dbc5;
            write_local_cert_cold_1();
          }
          if (iVar3 == 0) {
LAB_0010db6a:
            if (v_flag != 0) {
              pFStack_1938 = (FILE *)0x10db7d;
              puts("CN\'s of request and certificate matched!");
            }
          }
          else {
            pFStack_1938 = (FILE *)0x10db04;
            pXVar17 = X509_get_subject_name(pXVar16);
            pFStack_1938 = (FILE *)0x10db1c;
            X509_NAME_oneline(pXVar17,acStack_1130,0x400);
            pFStack_1938 = (FILE *)0x10db28;
            pXVar17 = (X509_NAME *)X509_REQ_get_subject_name(request);
            pFVar9 = aFStack_1530;
            pFStack_1938 = (FILE *)0x10db40;
            X509_NAME_oneline(pXVar17,(char *)pFVar9,0x400);
            if (v_flag != 0) {
              pFStack_1938 = (FILE *)0x10db5b;
              printf(" X509_NAME_cmp() workaround: strcmp request subject (%s) to cert subject (%s)\n"
                     ,pFVar9,acStack_1130);
            }
            pFStack_1938 = (FILE *)0x10db66;
            iVar3 = strcmp(acStack_1130,(char *)pFVar9);
            if (iVar3 == 0) goto LAB_0010db6a;
            pFStack_1938 = (FILE *)0x10dbcf;
            write_local_cert_cold_2();
          }
          pFStack_1938 = (FILE *)0x10db85;
          b = (char **)X509_get_subject_name(pXVar16);
          pFStack_1938 = (FILE *)0x10db90;
          pXVar17 = X509_get_issuer_name(pXVar16);
          pFStack_1938 = (FILE *)0x10db9b;
          pFVar10 = (FILE *)b;
          iVar3 = X509_NAME_cmp((X509_NAME *)b,pXVar17);
          if (iVar3 != 0) break;
          uVar2 = (int)__size + 1;
          __size = (char **)(ulong)uVar2;
          pFStack_1938 = (FILE *)0x10dbaa;
          pFVar10 = pFVar8;
          iVar3 = OPENSSL_sk_num();
          pXVar16 = (X509 *)localcert;
        } while ((int)uVar2 < iVar3);
      }
      localcert = (X509 *)pXVar16;
      pXVar29 = localcert;
      if (localcert == (X509 *)0x0) {
        pFStack_1938 = (FILE *)0x10dc7f;
        write_local_cert_cold_5();
      }
      else {
        __size = &l_char;
        pFStack_1938 = (FILE *)0x10dc00;
        pFVar10 = (FILE *)l_char;
        pFVar18 = fopen(l_char,"w");
        if (pFVar18 != (FILE *)0x0) {
          if (v_flag != 0) {
            pFStack_1938 = (FILE *)0x10dc2a;
            printf("%s: certificate written as %s\n",pname,l_char);
          }
          if (d_flag != 0) {
            pFStack_1938 = (FILE *)0x10dc4c;
            PEM_write_X509(_stdout,(X509 *)localcert);
          }
          pFStack_1938 = (FILE *)0x10dc5b;
          pFVar10 = pFVar18;
          iVar3 = PEM_write_X509(pFVar18,(X509 *)localcert);
          pFVar8 = pFVar18;
          if (iVar3 == 1) {
            pFStack_1938 = (FILE *)0x10dc68;
            iVar3 = fclose(pFVar18);
            return iVar3;
          }
          goto LAB_0010dc84;
        }
      }
      pFStack_1938 = (FILE *)0x10dc84;
      write_local_cert_cold_4();
LAB_0010dc84:
      pFStack_1938 = (FILE *)write_other_cert;
      write_local_cert_cold_3();
      piStack_1958 = &v_flag;
      uVar23 = *(undefined8 *)(*(long *)(pFVar10->__pad5 + 0x20) + 0x10);
      pFStack_1d70 = (FILE *)0x10dcb4;
      pFStack_1960 = pFVar8;
      pXStack_1950 = pXVar29;
      pXStack_1948 = (X509_CRL *)__size;
      pFStack_1940 = (FILE *)b;
      pFStack_1938 = pFVar9;
      iVar3 = OPENSSL_sk_num(uVar23);
      piVar27 = &v_flag;
      if (0 < iVar3) {
        pXVar29 = (X509 *)0x0;
        do {
          pFStack_1d70 = (FILE *)0x10dccd;
          pFVar8 = (FILE *)OPENSSL_sk_value(uVar23,pXVar29);
          pcVar25 = pname;
          if (v_flag != 0) {
            pFStack_1d70 = (FILE *)0x10dcee;
            pXVar17 = X509_get_subject_name((X509 *)pFVar8);
            pFStack_1d70 = (FILE *)0x10dcfe;
            pcVar26 = X509_NAME_oneline(pXVar17,(char *)aiStack_1d68,0x400);
            pFStack_1d70 = (FILE *)0x10dd12;
            printf("%s: found certificate with\n  subject: %s\n",pcVar25,pcVar26);
            pFStack_1d70 = (FILE *)0x10dd1a;
            pXVar17 = X509_get_issuer_name((X509 *)pFVar8);
            pFStack_1d70 = (FILE *)0x10dd2a;
            pcVar26 = X509_NAME_oneline(pXVar17,(char *)aiStack_1d68,0x400);
            pFStack_1d70 = (FILE *)0x10dd3b;
            printf("  issuer: %s\n",pcVar26);
            pFVar9 = (FILE *)pcVar25;
          }
          pFStack_1d70 = (FILE *)0x10dd43;
          x_00 = X509_get_serialNumber((X509 *)pFVar8);
          pFStack_1d70 = (FILE *)0x10dd56;
          iVar3 = ASN1_INTEGER_cmp(x_00,*(ASN1_INTEGER **)((long)pFVar10->__pad3 + 8));
          piVar27 = aiStack_1d68;
          if (iVar3 == 0) goto LAB_0010dd73;
          uVar2 = (int)pXVar29 + 1;
          pXVar29 = (X509 *)(ulong)uVar2;
          pFStack_1d70 = (FILE *)0x10dd65;
          iVar3 = OPENSSL_sk_num(uVar23);
          piVar27 = aiStack_1d68;
        } while ((int)uVar2 < iVar3);
      }
      do {
        pFStack_1d70 = (FILE *)0x10dd73;
        write_other_cert_cold_3();
LAB_0010dd73:
      } while (pFVar8 == (FILE *)0x0);
      pFStack_1d70 = (FILE *)0x10dd8e;
      pFVar18 = (FILE *)w_char;
      pFVar24 = fopen(w_char,"w");
      if (pFVar24 == (FILE *)0x0) {
        pFStack_1d70 = (FILE *)0x10de0a;
        write_other_cert_cold_2();
      }
      else {
        if (v_flag != 0) {
          pFStack_1d70 = (FILE *)0x10ddbd;
          printf("%s: certificate written as %s\n",pname,w_char);
        }
        if (d_flag != 0) {
          pFStack_1d70 = (FILE *)0x10dddb;
          PEM_write_X509(_stdout,(X509 *)pFVar8);
        }
        pFStack_1d70 = (FILE *)0x10dde6;
        pFVar18 = pFVar24;
        iVar3 = PEM_write_X509(pFVar24,(X509 *)pFVar8);
        pFVar10 = pFVar24;
        if (iVar3 == 1) {
          pFStack_1d70 = (FILE *)0x10ddf3;
          iVar3 = fclose(pFVar24);
          return iVar3;
        }
      }
      pFStack_1d70 = (FILE *)write_ca_ra;
      write_other_cert_cold_1();
      ppcStack_1d78 = &w_char;
      pFStack_1d98 = pFVar8;
      piStack_1d90 = piVar27;
      pXStack_1d88 = pXVar29;
      pFStack_1d80 = pFVar10;
      pFStack_1d70 = pFVar9;
      pBVar5 = BIO_new_mem_buf(pFVar18->_IO_read_end,*(int *)&pFVar18->_IO_read_base);
      pPVar11 = d2i_PKCS7_bio(pBVar5,(PKCS7 **)0x0);
      if (pPVar11 == (PKCS7 *)0x0) {
        pcVar25 = "%s: error reading PKCS#7 data\n";
LAB_0010de5c:
        fprintf(_stderr,pcVar25,pname);
LAB_0010de66:
        ERR_print_errors_fp(_stderr);
      }
      else {
        iVar3 = OBJ_obj2nid(pPVar11->type);
        if (iVar3 == 0x16) {
          lVar28 = ((pPVar11->d).data)->flags;
          if (lVar28 != 0) {
            pPStack_25f8 = pPVar11;
            pBStack_25f0 = pBVar5;
            iVar3 = OPENSSL_sk_num(lVar28);
            if (0 < iVar3) {
              uVar13 = 0;
              lStack_25e8 = lVar28;
              do {
                memset(acStack_21a0,0,0x400);
                memset(acStack_25a0,0,0x400);
                pXVar16 = (X509 *)OPENSSL_sk_value(lVar28,uVar13);
                snprintf(acStack_25a0,0x400,"%s-%d",c_char,uVar13);
                pcVar25 = pname;
                if (v_flag != 0) {
                  pXVar17 = X509_get_subject_name(pXVar16);
                  pcVar26 = X509_NAME_oneline(pXVar17,acStack_21a0,0x400);
                  printf("\n%s: found certificate with\n  subject: %s\n",pcVar25,pcVar26);
                  if (v_flag != 0) {
                    pXVar17 = X509_get_issuer_name(pXVar16);
                    pcVar25 = X509_NAME_oneline(pXVar17,acStack_21a0,0x400);
                    printf("  issuer: %s\n",pcVar25);
                  }
                }
                iVar3 = X509_digest(pXVar16,(EVP_MD *)fp_alg,abStack_25e0,&uStack_25fc);
                if (iVar3 == 0) goto LAB_0010de66;
                iVar3 = X509_get_ext_by_NID(pXVar16,0x57,-1);
                if (iVar3 < 0) {
                  if (v_flag != 0) {
                    puts("  basic constraints: (not included)");
                  }
                }
                else {
                  pXVar19 = X509_get_ext(pXVar16,iVar3);
                  if (v_flag != 0) {
                    printf("  basic constraints: ");
                    X509V3_EXT_print_fp(_stdout,pXVar19,0,0);
                    putchar(10);
                  }
                }
                iVar3 = X509_get_ext_by_NID(pXVar16,0x53,-1);
                if (iVar3 < 0) {
                  if (v_flag != 0) {
                    puts("  usage: (not included)");
                    goto LAB_0010e0d7;
                  }
                }
                else {
                  pXVar19 = X509_get_ext(pXVar16,iVar3);
                  if (v_flag != 0) {
                    printf("  usage: ");
                    X509V3_EXT_print_fp(_stdout,pXVar19,0,0);
                    putchar(10);
LAB_0010e0d7:
                    if (v_flag != 0) {
                      iVar3 = EVP_MD_get_type(fp_alg);
                      pcVar25 = OBJ_nid2sn(iVar3);
                      printf("  %s fingerprint: ",pcVar25);
                      uVar22 = (ulong)uStack_25fc;
                      if (0 < (int)uStack_25fc) {
                        uVar20 = 0;
                        do {
                          uVar1 = uVar20 + 1;
                          uVar23 = 10;
                          if (uVar1 != (uVar22 & 0xffffffff)) {
                            uVar23 = 0x3a;
                          }
                          printf("%02X%c",(ulong)abStack_25e0[uVar20],uVar23);
                          uVar22 = (ulong)(int)uStack_25fc;
                          uVar20 = uVar1;
                        } while ((long)uVar1 < (long)uVar22);
                      }
                    }
                  }
                }
                pFVar9 = fopen(acStack_25a0,"w");
                if (pFVar9 == (FILE *)0x0) {
                  pcVar25 = "%s: cannot open cert file for writing\n";
                  goto LAB_0010dea6;
                }
                if (v_flag != 0) {
                  printf("%s: certificate written as %s\n",pname,acStack_25a0);
                }
                if (d_flag != 0) {
                  PEM_write_X509(_stdout,pXVar16);
                }
                iVar3 = PEM_write_X509(pFVar9,pXVar16);
                if (iVar3 != 1) {
                  pcVar25 = "%s: error while writing certificate file\n";
                  goto LAB_0010de5c;
                }
                fclose(pFVar9);
                lVar28 = lStack_25e8;
                uVar2 = (int)uVar13 + 1;
                uVar13 = (ulong)uVar2;
                iVar3 = OPENSSL_sk_num(lStack_25e8);
              } while ((int)uVar2 < iVar3);
            }
            PKCS7_free(pPStack_25f8);
            BIO_free(pBStack_25f0);
            exit(0);
          }
          pcVar25 = "%s: cannot find certificates\n";
LAB_0010dea6:
          fprintf(_stderr,pcVar25,pname);
        }
        else {
          printf("%s: wrong PKCS#7 type\n",pname);
        }
      }
      exit(0x5d);
    }
  }
  pFStack_440 = (FILE *)0x10cf79;
  pkcs7_verify_unwrap_cold_9();
LAB_0010cf79:
  pFStack_440 = (FILE *)0x10cf91;
  printf("%s: error verifying signature Error \n",pname);
  pFStack_440 = (FILE *)0x10cfa0;
  ERR_print_errors_fp(_stderr);
  pFStack_440 = (FILE *)0x10cfaa;
  exit(0x61);
}

Assistant:

int pkcs7_verify_unwrap(struct scep *s , char * cachainfile ) {
	BIO				*memorybio;
	BIO				*outbio;
	BIO				*pkcs7bio;
	int				len, bytes, used;
	STACK_OF(PKCS7_SIGNER_INFO)	*sk;
	PKCS7_SIGNER_INFO		*si;
	unsigned char			buffer[1024];
    X509   				*signercert;
    FILE 				*fp;

    X509_STORE_CTX 		*cert_ctx;

	X509_STORE *cert_store=NULL;


	/* Create new memory BIO for outer PKCS#7 */
	memorybio = BIO_new(BIO_s_mem());

	/* Read in data */
	if (v_flag)
		printf("%s: reading outer PKCS#7\n",pname);
	if ((len = BIO_write(memorybio, s->reply_payload, s->reply_len)) <= 0) {
		fprintf(stderr, "%s: error reading PKCS#7 data\n", pname);
		ERR_print_errors_fp(stderr);
		exit (SCEP_PKISTATUS_P7);
	}
	if (v_flag)
		printf("%s: PKCS#7 payload size: %d bytes\n", pname, len);
	BIO_set_flags(memorybio, BIO_FLAGS_MEM_RDONLY);
	s->reply_p7 = d2i_PKCS7_bio(memorybio, NULL);
	if (!s->reply_p7) {
		fprintf(stderr, "%s: Error in d2i_PKCS7_bio.\n", pname);
		ERR_print_errors_fp(stderr);
		exit (SCEP_PKISTATUS_P7);
	}
	if (d_flag) {
		printf("%s: printing PEM fomatted PKCS#7\n", pname);
		PEM_write_PKCS7(stdout, s->reply_p7);
	}

	 /* Make sure this is a signed PKCS#7 */
        if (!PKCS7_type_is_signed(s->reply_p7)) {
		fprintf(stderr, "%s: PKCS#7 is not signed!\n", pname);
		ERR_print_errors_fp(stderr);
		exit (SCEP_PKISTATUS_P7);
        }

	/* Create BIO for content data */
	pkcs7bio = PKCS7_dataInit(s->reply_p7, NULL);
	if (pkcs7bio == NULL) {
		fprintf(stderr, "%s: cannot get PKCS#7 data\n", pname);
		ERR_print_errors_fp(stderr);
		exit (SCEP_PKISTATUS_P7);
	}

	/* Copy enveloped data from PKCS#7 */
	outbio = BIO_new(BIO_s_mem());
	used = 0;
	for (;;) {
		bytes = BIO_read(pkcs7bio, buffer, sizeof(buffer));
		used += bytes;
		if (bytes <= 0) break;
		BIO_write(outbio, buffer, bytes);
	}
	BIO_flush(outbio);
	if (v_flag)
		printf("%s: PKCS#7 contains %d bytes of signed data\n",
			pname, used);

	/* Get signer */
	sk = PKCS7_get_signer_info(s->reply_p7);
	if (sk == NULL) {
		fprintf(stderr, "%s: cannot get signer info!\n", pname);
		ERR_print_errors_fp(stderr);
		exit (SCEP_PKISTATUS_P7);
	}

	/* Verify signature */
	if (v_flag)
		printf("%s: verifying signature\n", pname);
	si = sk_PKCS7_SIGNER_INFO_value(sk, 0);

	signercert = PKCS7_cert_from_signer_info(s->reply_p7,si);
	if(signercert == NULL ) printf("%s: Can't read signer cert from pkcs7\n", pname);

//int reson=0;

	if (PKCS7_signatureVerify(pkcs7bio, s->reply_p7, si,signercert ) <= 0) {
		//reson = ERR_GET_REASON(ERR_peek_last_error());
		printf("%s: error verifying signature Error \n", pname);
		ERR_print_errors_fp(stderr);
		exit (SCEP_PKISTATUS_P7);
	}
	if (v_flag)
		printf("%s: signature ok\n", pname);

	/*verify certificates*/


	cert_store=X509_STORE_new();
	if(cert_store == NULL)
		fprintf(stderr, "%s: error verifying certificates \n", pname);

	X509_STORE_set_flags(cert_store, 0);

    //X509_STORE_load_locations(cert_store,certsfile,certsdir);
    X509_STORE_load_locations(cert_store,cachainfile,NULL);

    if(!(cert_ctx = X509_STORE_CTX_new())) {;
    fprintf(stderr, "%s: error creating certificate chain \n", pname);
    }

    if(!X509_STORE_CTX_init(cert_ctx,cert_store,signercert,NULL))
    {
    	fprintf(stderr, "%s: error verifying certificates \n", pname);
    }

    //X509_STORE_CTX_set_purpose(cert_ctx, purpose);

    if( !X509_verify_cert(cert_ctx)) {
    	fprintf(stderr, "%s: The signer certificate verification failed \n", pname);
    }

    /*Write pem encoded signer certificate */
	if(w_flag)
	{

#ifdef WIN32
		if ((fopen_s(&fp, w_char, "w")))
#else
		if (!(fp = fopen(w_char, "w")))
#endif
		{
			fprintf(stderr, "%s: cannot open cert file for writing\n",
					w_char);
			exit (SCEP_PKISTATUS_FILE);
		}
		if (v_flag)
			printf("%s: writing cert\n", w_char);
		if (d_flag)
			PEM_write_X509(stdout, signercert);

		if (PEM_write_X509(fp, signercert) != 1) {
			fprintf(stderr, "%s: error while writing certificate "
				"file\n", w_char);
			ERR_print_errors_fp(stderr);
			exit (SCEP_PKISTATUS_FILE);
		}else{
			if(v_flag)
			printf("%s: certificate written as %s\n", pname, w_char);
		}

		(void)fclose(fp);
	}
	/* Copy enveloped data into PKCS#7 */
	s->reply_p7 = d2i_PKCS7_bio(outbio, NULL);
	if (!s->reply_p7) {
		fprintf(stderr, "%s: Error in d2i_PKCS7_bio.\n", pname);
		ERR_print_errors_fp(stderr);
		exit (SCEP_PKISTATUS_P7);
	}

	X509_STORE_free(cert_store);
	X509_STORE_CTX_cleanup(cert_ctx);

	return (0);
}